

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void * __thiscall
testing::internal::UntypedFunctionMockerBase::MockObject(UntypedFunctionMockerBase *this)

{
  void *pvVar1;
  MutexLock l;
  allocator local_39;
  GTestMutexLock local_38;
  string local_30;
  
  local_38.mutex_ = (MutexBase *)g_gmock_mutex;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  pvVar1 = this->mock_obj_;
  std::__cxx11::string::string
            ((string *)&local_30,
             "MockObject() must not be called before RegisterOwner() or SetOwnerAndName() has been called."
             ,&local_39);
  Assert(pvVar1 != (void *)0x0,
         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/third_party/googletest/googlemock/src/gmock-spec-builders.cc"
         ,0x15c,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pvVar1 = this->mock_obj_;
  GTestMutexLock::~GTestMutexLock(&local_38);
  return pvVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const void* mock_obj;
  {
    // We protect mock_obj_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(mock_obj_ != nullptr, __FILE__, __LINE__,
           "MockObject() must not be called before RegisterOwner() or "
           "SetOwnerAndName() has been called.");
    mock_obj = mock_obj_;
  }
  return mock_obj;
}